

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# writer.h
# Opt level: O0

bool __thiscall
rapidjson::
Writer<rapidjson::GenericStringBuffer<rapidjson::UTF8<char>,_rapidjson::CrtAllocator>,_rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator,_0U>
::WriteEndObject(Writer<rapidjson::GenericStringBuffer<rapidjson::UTF8<char>,_rapidjson::CrtAllocator>,_rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator,_0U>
                 *this)

{
  Ch in_stack_00000017;
  GenericStringBuffer<rapidjson::UTF8<char>,_rapidjson::CrtAllocator> *in_stack_00000018;
  
  GenericStringBuffer<rapidjson::UTF8<char>,_rapidjson::CrtAllocator>::Put
            (in_stack_00000018,in_stack_00000017);
  return true;
}

Assistant:

bool WriteEndObject()   { os_->Put('}'); return true; }